

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint32 stbi__get32be(stbi__context *s)

{
  int iVar1;
  int iVar2;
  stbi__uint32 z;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = stbi__get16be((stbi__context *)
                        CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar2 = iVar1 << 0x10;
  iVar1 = stbi__get16be((stbi__context *)CONCAT44(iVar1,iVar2));
  return iVar2 + iVar1;
}

Assistant:

static stbi__uint32 stbi__get32be(stbi__context *s)
{
   stbi__uint32 z = stbi__get16be(s);
   return (z << 16) + stbi__get16be(s);
}